

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::cleanupPagesNotInHistory(QWizardPrivate *this)

{
  long *plVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  int idx;
  _Rb_tree_color local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  iVar4._M_node = (_Base_ptr)QMap<int,_QWizardPage_*>::begin(&this->pageMap);
  iVar5 = QMap<int,_QWizardPage_*>::end(&this->pageMap);
  for (; (iterator)iVar4._M_node != iVar5.i._M_node;
      iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node)) {
    local_3c = iVar4._M_node[1]._M_color;
    p_Var2 = (iVar4._M_node[1]._M_parent)->_M_parent;
    if (*(char *)((long)&p_Var2[0x18]._M_parent + 6) == '\x01') {
      bVar3 = QListSpecialMethodsBase<int>::contains<int>
                        ((QListSpecialMethodsBase<int> *)&this->history,(int *)&local_3c);
      if (!bVar3) {
        (**(code **)(*plVar1 + 0x1e0))(plVar1,local_3c);
        *(undefined1 *)((long)&p_Var2[0x18]._M_parent + 6) = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::cleanupPagesNotInHistory()
{
    Q_Q(QWizard);

    for (auto it = pageMap.begin(), end = pageMap.end(); it != end; ++it) {
        const auto idx = it.key();
        const auto page = it.value()->d_func();
        if (page->initialized && !history.contains(idx)) {
            q->cleanupPage(idx);
            page->initialized = false;
        }
    }
}